

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmBinaryReader.cpp
# Opt level: O0

void __thiscall
Wasm::WasmBinaryReader::ReadMemorySection(WasmBinaryReader *this,bool isImportSection)

{
  bool bVar1;
  uint32 maxInitial;
  uint32 maxMaximum;
  MemorySectionLimits MVar2;
  SectionLimits local_38;
  undefined1 local_28 [8];
  MemorySectionLimits limits;
  uint32 count;
  uint32 length;
  bool isImportSection_local;
  WasmBinaryReader *this_local;
  
  limits.super_SectionLimits.maximum = 0;
  if (isImportSection) {
    limits.super_SectionLimits.initial = 1;
  }
  else {
    limits.super_SectionLimits.initial =
         LEB128<unsigned_int,32u>(this,&limits.super_SectionLimits.maximum);
  }
  if (limits.super_SectionLimits.initial < 2) {
    if (limits.super_SectionLimits.initial == 1) {
      maxInitial = Limits::GetMaxMemoryInitialPages();
      maxMaximum = Limits::GetMaxMemoryMaximumPages();
      MVar2 = ReadSectionLimitsBase<Wasm::MemorySectionLimits>
                        (this,maxInitial,maxMaximum,L"memory size too big");
      local_38._0_8_ = MVar2.super_SectionLimits._0_8_;
      local_28._0_4_ = local_38.flags;
      local_28._4_4_ = local_38.initial;
      local_38.maximum = MVar2.super_SectionLimits.maximum;
      limits.super_SectionLimits.flags = local_38.maximum;
      bVar1 = Threads::IsEnabled();
      if (((bVar1) &&
          (bVar1 = MemorySectionLimits::IsShared((MemorySectionLimits *)local_28), bVar1)) &&
         (bVar1 = SectionLimits::HasMaximum((SectionLimits *)local_28), !bVar1)) {
        ThrowDecodingError(this,L"Shared memory must have a maximum size");
      }
      Js::WebAssemblyModule::InitializeMemory(this->m_module,(MemorySectionLimits *)local_28);
    }
    return;
  }
  ThrowDecodingError(this,L"Maximum of 1 memory allowed");
}

Assistant:

void WasmBinaryReader::ReadMemorySection(bool isImportSection)
{
    uint32 length = 0;
    uint32 count;
    if (isImportSection)
    {
        count = 1;
    }
    else
    {
        count = LEB128(length);
    }
    if (count > 1)
    {
        ThrowDecodingError(_u("Maximum of 1 memory allowed"));
    }

    if (count == 1)
    {
        MemorySectionLimits limits = ReadSectionLimitsBase<MemorySectionLimits>(Limits::GetMaxMemoryInitialPages(), Limits::GetMaxMemoryMaximumPages(), _u("memory size too big"));
        if (Wasm::Threads::IsEnabled() && limits.IsShared() && !limits.HasMaximum())
        {
            ThrowDecodingError(_u("Shared memory must have a maximum size"));
        }
        m_module->InitializeMemory(&limits);
    }
}